

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O2

void mpireorderinglib::MPIX_Dist_graph_internode_cost
               (MPI_Comm dist_graph_comm,int *total_offnode_neighbors,int *max_offnode_neighbors)

{
  long lVar1;
  MPI_Group poVar2;
  MPI_Comm poVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int i;
  long lVar13;
  long alStack_b0 [2];
  code *pcStack_a0;
  int aiStack_98 [4];
  undefined4 local_88;
  int status;
  int dist_graph_rank;
  int node_group_rank;
  int n_sources;
  int is_weighted;
  MPI_Comm node_comm;
  MPI_Group node_group;
  MPI_Group dist_graph_group;
  int *local_58;
  undefined1 *local_50;
  MPI_Comm local_48;
  uint local_40;
  int local_3c;
  int n_dest;
  int node_offnode_comm_size;
  int node_group_size;
  int local_offnode_neighbors;
  
  pcStack_a0 = (code *)0x14ce64;
  MPI_Topo_test(dist_graph_comm,aiStack_98 + 3);
  if (aiStack_98[3] == 3) {
    *total_offnode_neighbors = 0;
    *max_offnode_neighbors = 0;
    pcStack_a0 = (code *)0x14ce8e;
    dist_graph_group = (MPI_Group)total_offnode_neighbors;
    local_58 = max_offnode_neighbors;
    MPI_Comm_rank(dist_graph_comm,&local_88);
    uVar11 = 0;
    pcStack_a0 = (code *)0x14ceae;
    MPI_Comm_split_type(dist_graph_comm,0,local_88,&ompi_mpi_info_null,&n_sources);
    pcStack_a0 = (code *)0x14cebd;
    MPI_Comm_group(_n_sources,&node_comm);
    pcStack_a0 = (code *)0x14cecc;
    MPI_Group_size(node_comm,&n_dest);
    pcStack_a0 = (code *)0x14ced8;
    MPI_Group_rank(node_comm,&status);
    uVar6 = 0xffffffffffffffff;
    if (-1 < (long)n_dest) {
      uVar6 = (long)n_dest * 4;
    }
    pcStack_a0 = (code *)0x14cef7;
    pvVar4 = operator_new__(uVar6);
    pcStack_a0 = (code *)0x14cf02;
    pvVar5 = operator_new__(uVar6);
    pcStack_a0 = (code *)0x14cf15;
    local_48 = dist_graph_comm;
    MPI_Comm_group(dist_graph_comm,&node_group);
    uVar6 = 0;
    if (0 < n_dest) {
      uVar6 = (ulong)(uint)n_dest;
    }
    for (; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      *(int *)((long)pvVar4 + uVar11 * 4) = (int)uVar11;
    }
    pcStack_a0 = (code *)0x14cf46;
    MPI_Group_translate_ranks(node_comm,n_dest,pvVar4,node_group,pvVar5);
    poVar3 = local_48;
    pcStack_a0 = (code *)0x14cf64;
    MPI_Dist_graph_neighbors_count(local_48,&dist_graph_rank,&local_40,&node_group_rank);
    uVar6 = (ulong)local_40 * 4 + 0xf & 0xfffffffffffffff0;
    lVar1 = (-0x98 - ((ulong)(uint)dist_graph_rank * 4 + 0xf & 0xfffffffffffffff0)) - uVar6;
    lVar12 = (long)aiStack_98 +
             ((lVar1 - ((ulong)(uint)dist_graph_rank * 4 + 0xf & 0xfffffffffffffff0)) - uVar6) +
             0x98;
    local_50 = (undefined1 *)aiStack_98;
    *(long *)(lVar12 + -0x10) = lVar12;
    *(undefined8 *)(lVar12 + -0x18) = 0x14cfca;
    MPI_Dist_graph_neighbors(poVar3);
    piVar9 = *(int **)(lVar12 + -0x10);
    node_offnode_comm_size = 0;
    iVar10 = 0;
    for (lVar13 = 0; lVar13 < (int)local_40; lVar13 = lVar13 + 1) {
      local_3c = *(int *)((long)aiStack_98 + lVar13 * 4 + lVar1 + 0x98);
      if (local_3c != -2) {
        lVar7 = (long)n_dest;
        *(undefined8 *)(lVar12 + -8) = 0x14d005;
        piVar8 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (pvVar5,(void *)(lVar7 * 4 + (long)pvVar5),&local_3c,piVar9);
        piVar9 = (int *)((long)n_dest * 4 + (long)pvVar5);
        if (piVar8 == piVar9) {
          iVar10 = iVar10 + 1;
          node_offnode_comm_size = iVar10;
        }
      }
    }
    *(undefined8 *)(lVar12 + -8) = 1;
    uVar6 = *(ulong *)(lVar12 + -8);
    *(undefined8 *)(lVar12 + -8) = 0x14d04f;
    MPI_Allreduce(&node_offnode_comm_size,&local_3c,uVar6 & 0xffffffff,&ompi_mpi_int,
                  &ompi_mpi_op_sum,_n_sources);
    poVar3 = local_48;
    piVar9 = local_58;
    *(undefined8 *)(lVar12 + -8) = 0x14d06f;
    MPI_Allreduce(&local_3c,piVar9,uVar6 & 0xffffffff,&ompi_mpi_int,&ompi_mpi_op_max,poVar3);
    poVar2 = dist_graph_group;
    *(undefined8 *)(lVar12 + -8) = 0x14d08c;
    MPI_Allreduce(&node_offnode_comm_size,poVar2,uVar6 & 0xffffffff,&ompi_mpi_int,&ompi_mpi_op_sum,
                  poVar3);
    *(undefined8 *)(lVar12 + -8) = 0x14d094;
    operator_delete__(pvVar4);
    *(undefined8 *)(lVar12 + -8) = 0x14d09c;
    operator_delete__(pvVar5);
    return;
  }
  pcStack_a0 = MPIX_Dist_graph_create_from_cart_comm;
  __assert_fail("status == MPI_DIST_GRAPH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/Evaluation/evaluation_method.cpp"
                ,0x4d,
                "void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm, int *, int *)");
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm dist_graph_comm,
													  int *total_offnode_neighbors,
													  int *max_offnode_neighbors) {
  int status;
  MPI_Topo_test(dist_graph_comm, &status);
  assert(status == MPI_DIST_GRAPH);
  CARTREORDER_INFO("Value written in total before " + std::to_string(*total_offnode_neighbors));
  CARTREORDER_INFO("Value written in max before " + std::to_string(*max_offnode_neighbors));
  *total_offnode_neighbors = 0;
  *max_offnode_neighbors = 0;

  //find out which processes are on the same node
  MPI_Comm node_comm;
  MPI_Group node_group;
  MPI_Group dist_graph_group;

  int dist_graph_rank;
  MPI_Comm_rank(dist_graph_comm, &dist_graph_rank);

  MPI_Comm_split_type(dist_graph_comm, MPI_COMM_TYPE_SHARED,
					  dist_graph_rank, MPI_INFO_NULL, &node_comm);

  int node_group_size, node_group_rank;

  //extract the corresponding groups
  MPI_Comm_group(node_comm, &node_group);
  MPI_Group_size(node_group, &node_group_size);
  MPI_Group_rank(node_group, &node_group_rank);

  int *const group_ranks = new int[node_group_size];
  int *const dist_graph_comm_ranks = new int[node_group_size];

  MPI_Comm_group(dist_graph_comm, &dist_graph_group);

  //initialize node group ranks array
  for (int i{0}; i < node_group_size; i++) {
	group_ranks[i] = i;
  }

  //translate the ranks in the group to the ranks
  //in the old communicator dist_graph_comm
  MPI_Group_translate_ranks(node_group, node_group_size,
							group_ranks, dist_graph_group, dist_graph_comm_ranks);

  int n_sources, n_dest, is_weighted;
  MPI_Dist_graph_neighbors_count(dist_graph_comm, &n_sources,
								 &n_dest, &is_weighted);

  //Each process only counts the communication he starts
  //Good idea to do so?
  int sources[n_sources];
  int dest[n_dest];
  int source_weights[n_sources];
  int dest_weights[n_dest];

  MPI_Dist_graph_neighbors(dist_graph_comm, n_sources, sources,
						   source_weights, n_dest, dest, dest_weights);

  //Explicitly reset the neighbor count and start from
  //zero. Anotherwise one would count MPI_PROC_NULL.
  //Start locally und communicate globally.
  int local_offnode_neighbors = 0;
  int *index_of_neighbor;

  // Another assumption was made, that the number on each
  // process is small. Meaning we have
  // O(num_oncore_pe*neighbors) operations. No presorting
  // of neighbors is done.
  // Only the destination targets are counted
  for (int i{0}; i < n_dest; i++) {
	int neighbor = dest[i];
	if (neighbor == MPI_PROC_NULL)
	  continue;

	index_of_neighbor = std::find(dist_graph_comm_ranks,
								  dist_graph_comm_ranks + node_group_size,
								  neighbor);

	//Increase offnode neighbor count if no index
	//was found
	if (index_of_neighbor == dist_graph_comm_ranks + node_group_size) {
	  local_offnode_neighbors += 1;
	}
  }

  CARTREORDER_INFO("Rank " + std::to_string(dist_graph_rank) + " has " + std::to_string(local_offnode_neighbors) + " off node neighbors");

  int node_offnode_comm_size;
  MPI_Allreduce(&local_offnode_neighbors,
				&node_offnode_comm_size,
				1, MPI_INT, MPI_SUM, node_comm);

  //Communicate max offnode neighbors
  MPI_Allreduce(&node_offnode_comm_size,
				max_offnode_neighbors,
				1, MPI_INT, MPI_MAX, dist_graph_comm);

  //Communciate local offnode neighbors to everybody
  //sum up and devide by two. Symmetry assumption
  MPI_Allreduce(&local_offnode_neighbors,
				total_offnode_neighbors,
				1, MPI_INT, MPI_SUM, dist_graph_comm);

  delete[] group_ranks;
  delete[] dist_graph_comm_ranks;
}